

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc_state_machine.hxx
# Opt level: O0

void __thiscall
calc_server::calc_state_machine::create_snapshot_internal
          (calc_state_machine *this,ptr<snapshot> *ss)

{
  bool bVar1;
  map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
  *this_00;
  element_type *this_01;
  iterator __position;
  size_type sVar2;
  long in_RDI;
  int ii;
  iterator entry;
  int num;
  int MAX_SNAPSHOTS;
  ptr<snapshot_ctx> ctx;
  lock_guard<std::mutex> ll;
  iterator in_stack_ffffffffffffff68;
  lock_guard<std::mutex> *in_stack_ffffffffffffff70;
  shared_ptr<nuraft::snapshot> *in_stack_ffffffffffffff78;
  _Self local_60;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar3;
  _Self in_stack_ffffffffffffffb0;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff70,(mutex_type *)in_stack_ffffffffffffff68._M_node);
  nuraft::
  cs_new<calc_server::calc_state_machine::snapshot_ctx,std::shared_ptr<nuraft::snapshot>&,std::atomic<long>&>
            (in_stack_ffffffffffffff78,(atomic<long> *)in_stack_ffffffffffffff70);
  this_00 = (map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
             *)(in_RDI + 0x18);
  this_01 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x18fc1c);
  nuraft::snapshot::get_last_log_idx(this_01);
  __position._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
       ::operator[](in_stack_ffffffffffffffb0._M_node,
                    (key_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>::operator=
            ((shared_ptr<calc_server::calc_state_machine::snapshot_ctx> *)this_00,
             (shared_ptr<calc_server::calc_state_machine::snapshot_ctx> *)
             in_stack_ffffffffffffff68._M_node);
  sVar2 = std::
          map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
          ::size((map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
                  *)0x18fc64);
  std::
  map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
  ::begin((map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
           *)in_stack_ffffffffffffff68._M_node);
  for (iVar3 = 0; iVar3 < (int)sVar2 + -3; iVar3 = iVar3 + 1) {
    local_60._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
         ::end(in_stack_ffffffffffffff68._M_node);
    bVar1 = std::operator==((_Self *)&stack0xffffffffffffffb0,&local_60);
    if (bVar1) break;
    in_stack_ffffffffffffff68 =
         std::
         map<unsigned_long,std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>>>>
         ::erase_abi_cxx11_(this_00,__position);
  }
  std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>::~shared_ptr
            ((shared_ptr<calc_server::calc_state_machine::snapshot_ctx> *)0x18fd3a);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x18fd47);
  return;
}

Assistant:

void create_snapshot_internal(ptr<snapshot> ss) {
        std::lock_guard<std::mutex> ll(snapshots_lock_);

        // Put into snapshot map.
        ptr<snapshot_ctx> ctx = cs_new<snapshot_ctx>(ss, cur_value_);
        snapshots_[ss->get_last_log_idx()] = ctx;

        // Maintain last 3 snapshots only.
        const int MAX_SNAPSHOTS = 3;
        int num = snapshots_.size();
        auto entry = snapshots_.begin();
        for (int ii = 0; ii < num - MAX_SNAPSHOTS; ++ii) {
            if (entry == snapshots_.end()) break;
            entry = snapshots_.erase(entry);
        }
    }